

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O0

int dowieldquiver(obj *newquiver)

{
  undefined4 uVar1;
  boolean bVar2;
  char *pcVar3;
  bool bVar4;
  long dummy;
  char *quivee_types;
  obj *newquiver_local;
  
  if (((uwep == (obj *)0x0) || (bVar4 = true, objects[uwep->otyp].oc_subtyp != '\x17')) &&
     (bVar4 = false, uswapwep != (obj *)0x0)) {
    bVar4 = objects[uswapwep->otyp].oc_subtyp == '\x17';
  }
  pcVar3 = "\x14\x15\x02";
  if (bVar4) {
    pcVar3 = "\x14\x15\r\x02";
  }
  multi = 0;
  if ((newquiver == (obj *)0x0) ||
     (bVar2 = validate_object(newquiver,pcVar3,"ready"), bVar2 != '\0')) {
    quivee_types = (char *)newquiver;
    if (newquiver == (obj *)0x0) {
      quivee_types = (char *)getobj(pcVar3,"ready",(obj **)0x0);
    }
    if (quivee_types != (char *)0x0) {
      if ((obj *)quivee_types == &zeroobj) {
        if (uquiver == (obj *)0x0) {
          pline("You already have no ammunition readied!");
          return 0;
        }
        pline("You now have no ammunition readied.");
        quivee_types = (char *)0x0;
        setuqwep((obj *)0x0);
      }
      else {
        if ((obj *)quivee_types == uquiver) {
          pline("That ammunition is already readied!");
          return 0;
        }
        if ((obj *)quivee_types == uwep) {
          bVar4 = true;
          if (uwep->quan < 2) {
            bVar4 = uwep->oartifact == '\x1d';
          }
          pcVar3 = "They are";
          if ((bool)(bVar4 ^ 1)) {
            pcVar3 = "That is";
          }
          pline("%s already being used as a weapon!",pcVar3);
          return 0;
        }
        if ((*(uint *)(quivee_types + 0x60) & 0x1f007f) != 0) {
          pline("You cannot ready that!");
          return 0;
        }
        if ((obj *)quivee_types == uswapwep) {
          setuswapwep((obj *)0x0);
          untwoweapon();
        }
        uVar1 = *(undefined4 *)(quivee_types + 0x60);
        *(uint *)(quivee_types + 0x60) = *(uint *)(quivee_types + 0x60) | 0x200;
        prinv((char *)0x0,(obj *)quivee_types,0);
        *(undefined4 *)(quivee_types + 0x60) = uVar1;
      }
      setuqwep((obj *)quivee_types);
    }
  }
  return 0;
}

Assistant:

int dowieldquiver(struct obj *newquiver)
{
	const char *quivee_types = (uslinging() ||
		  (uswapwep && objects[uswapwep->otyp].oc_skill == P_SLING)) ?
				  bullets : ready_objs;

	/* Since the quiver isn't in your hands, don't check cantwield(), */
	/* will_weld(), touch_petrifies(), etc. */
	multi = 0;

	if (newquiver && !validate_object(newquiver, quivee_types, "ready"))
		return 0;
	else if (!newquiver)
		/* Prompt for a new quiver */
		newquiver = getobj(quivee_types, "ready", NULL);
	if (!newquiver)
		/* Cancelled */
		return 0;

	/* Handle no object, or object in other slot */
	/* Any type is okay, since we give no intrinsics anyways */
	if (newquiver == &zeroobj) {
		/* Explicitly nothing */
		if (uquiver) {
			pline("You now have no ammunition readied.");
			setuqwep(newquiver = NULL);
		} else {
			pline("You already have no ammunition readied!");
			return 0;
		}
	} else if (newquiver == uquiver) {
		pline("That ammunition is already readied!");
		return 0;
	} else if (newquiver == uwep) {
		/* Prevent accidentally readying the main weapon */
		pline("%s already being used as a weapon!",
		      !is_plural(uwep) ? "That is" : "They are");
		return 0;
	} else if (newquiver->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL
			| W_SADDLE)) {
		pline("You cannot ready that!");
		return 0;
	} else {
		long dummy;


		/* Check if it's the secondary weapon */
		if (newquiver == uswapwep) {
			setuswapwep(NULL);
			untwoweapon();
		}

		/* Okay to put in quiver; print it */
		dummy = newquiver->owornmask;
		newquiver->owornmask |= W_QUIVER;
		prinv(NULL, newquiver, 0L);
		newquiver->owornmask = dummy;
	}

	/* Finally, place it in the quiver */
	setuqwep(newquiver);
	/* Take no time since this is a convenience slot */
	return 0;
}